

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_newproxy(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  undefined4 unaff_retaddr;
  int validproxy;
  int in_stack_00000010;
  int in_stack_00000014;
  lua_State *in_stack_00000018;
  ErrMsg in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int idx;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  lua_settop(in_RDI,in_stack_ffffffffffffffec);
  lua_newuserdata(L,CONCAT44(validproxy,unaff_retaddr));
  iVar1 = lua_toboolean(in_RDI,in_stack_ffffffffffffffec);
  if (iVar1 != 0) {
    iVar1 = lua_type((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int)((ulong)in_RDI >> 0x20));
    if (iVar1 == 1) {
      lua_createtable(in_stack_00000018,in_stack_00000014,in_stack_00000010);
      lua_pushvalue((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (int)((ulong)in_RDI >> 0x20));
      lua_pushboolean(in_RDI,in_stack_ffffffffffffffec);
      lua_rawset((lua_State *)CONCAT44(validproxy,unaff_retaddr),in_stack_fffffffffffffffc);
    }
    else {
      idx = 0;
      iVar1 = lua_getmetatable((lua_State *)CONCAT44(in_stack_00000014,in_stack_00000010),L._4_4_);
      if (iVar1 != 0) {
        lua_rawget(L,validproxy);
        idx = lua_toboolean(in_RDI,idx);
        lua_settop(in_RDI,idx);
      }
      if (idx == 0) {
        lj_err_arg(in_RDI,0,in_stack_ffffffffffffffe8);
      }
      lua_getmetatable((lua_State *)CONCAT44(in_stack_00000014,in_stack_00000010),L._4_4_);
    }
    lua_setmetatable(in_stack_00000018,in_stack_00000014);
  }
  return 1;
}

Assistant:

LJLIB_CF(newproxy)
{
  lua_settop(L, 1);
  lua_newuserdata(L, 0);
  if (lua_toboolean(L, 1) == 0) {  /* newproxy(): without metatable. */
    return 1;
  } else if (lua_isboolean(L, 1)) {  /* newproxy(true): with metatable. */
    lua_newtable(L);
    lua_pushvalue(L, -1);
    lua_pushboolean(L, 1);
    lua_rawset(L, lua_upvalueindex(1));  /* Remember mt in weak table. */
  } else {  /* newproxy(proxy): inherit metatable. */
    int validproxy = 0;
    if (lua_getmetatable(L, 1)) {
      lua_rawget(L, lua_upvalueindex(1));
      validproxy = lua_toboolean(L, -1);
      lua_pop(L, 1);
    }
    if (!validproxy)
      lj_err_arg(L, 1, LJ_ERR_NOPROXY);
    lua_getmetatable(L, 1);
  }
  lua_setmetatable(L, 2);
  return 1;
}